

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ProcessResult *
process_dir(ProcessResult *__return_storage_ptr__,path *dir,
           vector<IncludePath,_std::allocator<IncludePath>_> *include_paths,
           map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
           *headers)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pbVar2;
  pointer pbVar3;
  path *__p;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auVar7 [16];
  recursive_directory_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  EXT;
  path file;
  recursive_directory_iterator local_180;
  vector<IncludePath,_std::allocator<IncludePath>_> *local_170;
  map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
  *local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  string_type local_148;
  undefined1 local_128 [32];
  _List local_108;
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [3];
  path local_80;
  path local_58;
  
  local_128._0_8_ = local_128 + 0x10;
  local_170 = include_paths;
  local_168 = headers;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,".cpp","");
  local_108._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,".cxx","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,".cc","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,".h","");
  plVar5 = local_98;
  local_a8[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,".hpp","");
  __l._M_len = 5;
  __l._M_array = (iterator)local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_160,__l,(allocator_type *)&local_80);
  lVar6 = -0xa0;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  __return_storage_ptr__->untouched = 0;
  __return_storage_ptr__->failed = 0;
  __return_storage_ptr__->system_to_user = 0;
  __return_storage_ptr__->user_to_system = 0;
  __return_storage_ptr__->total = 0;
  __return_storage_ptr__->replaced_path = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_180,dir,none,(error_code *)0x0);
  while( true ) {
    _Var1._M_pi = local_180._M_dirs._M_refcount._M_pi;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = 0;
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)local_128);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    __p = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&local_180);
    std::filesystem::__cxx11::path::path((path *)local_128,__p);
    pbVar3 = local_160.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = local_160.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar7 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar7._8_8_ == -1 || auVar7._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_80);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_148,auVar7._0_8_);
      std::filesystem::__cxx11::path::path(&local_80,&local_148,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::filesystem::__cxx11::path_const>>
                      (pbVar2,pbVar3,&local_80);
    pbVar2 = local_160.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::filesystem::__cxx11::path::~path(&local_80);
    if (_Var4._M_current != pbVar2) {
      std::filesystem::__cxx11::path::path(&local_58,(path *)local_128);
      process_file(&local_58,local_170,local_168,__return_storage_ptr__);
      std::filesystem::__cxx11::path::~path(&local_58);
    }
    std::filesystem::__cxx11::path::~path((path *)local_128);
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_180);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  return __return_storage_ptr__;
}

Assistant:

ProcessResult
process_dir(fs::path dir, const std::vector<IncludePath> &include_paths,
            const std::map<IncludePath, std::vector<fs::path>> &headers) {
  const std::vector<std::string> EXT = {".cpp", ".cxx", ".cc", ".h", ".hpp"};

  ProcessResult result{};

  for (fs::recursive_directory_iterator it(dir);
       it != fs::recursive_directory_iterator(); ++it) {
    fs::path file = it->path();
    if (std::find(EXT.begin(), EXT.end(), file.extension()) != EXT.end()) {
      process_file(file, include_paths, headers, &result);
    }
  }

  return result;
}